

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

void __thiscall
VertexAttrib64Bit::LimitTest::setAttributes_a_vec
          (LimitTest *this,attributeConfiguration *configuration,GLint n_type,GLuint vertex,
          vector<double,_std::allocator<double>_> *out_buffer_data)

{
  uint uVar1;
  int iVar2;
  pointer pdVar3;
  GLint GVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  
  iVar8 = configuration->m_n_attributes_per_group;
  iVar13 = iVar8 * n_type;
  uVar1 = configuration->m_n_elements[n_type];
  iVar2 = configuration->m_vertex_length;
  GVar4 = calculateAttributeGroupOffset(this,configuration,n_type);
  iVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  uVar5 = GVar4 + iVar2 * vertex;
  uVar9 = vertex * 3 + iVar13;
  for (; uVar9 = uVar9 + 1, iVar6 != iVar8; iVar6 = iVar6 + 1) {
    pdVar3 = (out_buffer_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = uVar7;
    uVar10 = uVar9;
    uVar11 = uVar5;
    while( true ) {
      bVar14 = uVar12 == 0;
      uVar12 = uVar12 - 1;
      if (bVar14) break;
      pdVar3[uVar11] = (double)uVar10;
      uVar11 = uVar11 + 1;
      uVar10 = uVar10 + 1;
    }
    uVar5 = uVar5 + uVar1;
  }
  return;
}

Assistant:

void LimitTest::setAttributes_a_vec(const attributeConfiguration& configuration, GLint n_type, GLuint vertex,
									std::vector<GLdouble>& out_buffer_data) const
{
	const GLint n_attributes	= configuration.m_n_attributes_per_group;
	const GLint attribute_index = n_attributes * n_type;
	const GLint n_elements		= configuration.m_n_elements[n_type];
	GLuint		vertex_offset   = vertex * configuration.m_vertex_length;

	const GLint group_offset = calculateAttributeGroupOffset(configuration, n_type) + vertex_offset;

	/* Dvec2 attribute components should be assigned the following
	 vector values:
	 (n_attribute + gl_VertexID * 3 + 1,
	 n_attribute + gl_VertexID * 3 + 2)*/

	for (GLint attribute = 0; attribute < n_attributes; ++attribute)
	{
		const GLuint attribute_offset = n_elements * attribute + group_offset;

		for (GLint i = 0; i < n_elements; ++i)
		{
			out_buffer_data[attribute_offset + i] = attribute + attribute_index + vertex * 3 + i + 1;
		}
	}
}